

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

shared_ptr<helics::FilterOperator> __thiscall
helics::DelayFilterOperation::getOperator(DelayFilterOperation *this)

{
  shared_ptr<helics::MessageTimeOperator> *in_RDI;
  shared_ptr<helics::FilterOperator> sVar1;
  
  sVar1 = std::static_pointer_cast<helics::FilterOperator,helics::MessageTimeOperator>(in_RDI);
  sVar1.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::FilterOperator>)
         sVar1.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FilterOperator> DelayFilterOperation::getOperator()
{
    return std::static_pointer_cast<FilterOperator>(td);
}